

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

Abc_Cex_t * Gia_ManAreDeriveCex(Gia_ManAre_t *p,Gia_StaAre_t *pLast)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  Abc_Cex_t *pAVar5;
  Gia_StaAre_t *pCur;
  int local_74;
  int local_44;
  int local_40;
  int v;
  int i;
  int Var;
  Gia_StaAre_t *pPrev;
  Gia_StaAre_t *pSta;
  Vec_Ptr_t *vStates;
  Abc_Cex_t *pCex;
  Gia_StaAre_t *pLast_local;
  Gia_ManAre_t *p_local;
  
  if (p->iOutFail < 0) {
    __assert_fail("p->iOutFail >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x785,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
  }
  Gia_ManAreDeriveCexSatStart(p);
  p_00 = Vec_PtrAlloc(1000);
  pPrev = pLast;
  while (iVar1 = Gia_StaIsGood(p,pPrev), iVar1 != 0) {
    if (pPrev != pLast) {
      Vec_PtrPush(p_00,pPrev);
    }
    pPrev = Gia_StaPrev(p,pPrev);
  }
  iVar1 = Vec_PtrSize(p_00);
  if (iVar1 < 1) {
    __assert_fail("Vec_PtrSize(vStates) >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x78c,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
  }
  iVar1 = Gia_ManRegNum(p->pAig);
  iVar2 = Gia_ManPiNum(p->pAig);
  iVar3 = Vec_PtrSize(p_00);
  pAVar5 = Abc_CexAlloc(iVar1,iVar2,iVar3);
  iVar1 = Vec_PtrSize(p_00);
  pAVar5->iFrame = iVar1 + -1;
  pAVar5->iPo = p->iOutFail;
  _i = (Gia_StaAre_t *)0x0;
  local_40 = 0;
  do {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 <= local_40) {
      Vec_PtrFree(p_00);
      Gia_ManAreDeriveCexSatStop(p);
      return pAVar5;
    }
    pCur = (Gia_StaAre_t *)Vec_PtrEntry(p_00,local_40);
    if (local_40 == 0) {
      local_74 = p->iOutFail;
    }
    else {
      local_74 = -1;
    }
    Gia_ManAreDeriveCexSat(p,pCur,_i,local_74);
    for (local_44 = 0; iVar1 = Vec_IntSize(p->vCofVars), local_44 < iVar1; local_44 = local_44 + 1)
    {
      iVar1 = Vec_IntEntry(p->vCofVars,local_44);
      iVar2 = Gia_ManPiNum(p->pAig);
      if (iVar2 <= iVar1) {
        __assert_fail("Var < Gia_ManPiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                      ,0x79a,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
      }
      iVar2 = Gia_ManRegNum(p->pAig);
      iVar3 = Vec_PtrSize(p_00);
      iVar4 = Gia_ManPiNum(p->pAig);
      Abc_InfoSetBit((uint *)(pAVar5 + 1),iVar2 + ((iVar3 + -1) - local_40) * iVar4 + iVar1);
    }
    local_40 = local_40 + 1;
    _i = pCur;
  } while( true );
}

Assistant:

Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast )
{
    Abc_Cex_t * pCex;
    Vec_Ptr_t * vStates;
    Gia_StaAre_t * pSta, * pPrev;
    int Var, i, v;
    assert( p->iOutFail >= 0 );
    Gia_ManAreDeriveCexSatStart( p );
    // compute the trace
    vStates = Vec_PtrAlloc( 1000 );
    for ( pSta = pLast; Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        if ( pSta != pLast )
            Vec_PtrPush( vStates, pSta );
    assert( Vec_PtrSize(vStates) >= 1 );
    // start the counter-example
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pAig), Gia_ManPiNum(p->pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = p->iOutFail;
    // compute states
    pPrev = NULL;
    Vec_PtrForEachEntry( Gia_StaAre_t *, vStates, pSta, i )
    {
        Gia_ManAreDeriveCexSat( p, pSta, pPrev, (i == 0) ? p->iOutFail : -1 ); 
        pPrev = pSta;
        // create the counter-example
        Vec_IntForEachEntry( p->vCofVars, Var, v )
        {
            assert( Var < Gia_ManPiNum(p->pAig) );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pAig) + (Vec_PtrSize(vStates)-1-i) * Gia_ManPiNum(p->pAig) + Var );
        }
    }
    // free temporary things
    Vec_PtrFree( vStates );
    Gia_ManAreDeriveCexSatStop( p );
    return pCex;
}